

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

size_t __thiscall ByteArray::append(ByteArray *this,ByteArray *other)

{
  size_t sVar1;
  size_t __n;
  
  sVar1 = this->size_;
  __n = other->size_;
  grow(this,__n + sVar1);
  memcpy(this->data_ + this->size_,other->data_,__n);
  this->size_ = this->size_ + __n;
  return sVar1;
}

Assistant:

size_t ByteArray::append(const ByteArray& other)
{
	size_t oldSize = size();
	size_t otherSize = other.size();
	grow(size()+otherSize);
	memcpy(&data_[size_],other.data(),otherSize);
	size_ += otherSize;
	return oldSize;
}